

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noproxy.c
# Opt level: O0

_Bool Curl_cidr6_match(char *ipv6,char *network,uint bits)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  byte local_58 [8];
  uchar check [16];
  uchar address [16];
  int rest;
  int bytes;
  uint bits_local;
  char *network_local;
  char *ipv6_local;
  
  rest = bits;
  if (bits == 0) {
    rest = 0x80;
  }
  uVar1 = (uint)rest >> 3;
  uVar2 = rest & 7;
  iVar3 = inet_pton(10,ipv6,check + 8);
  if (iVar3 == 1) {
    iVar3 = inet_pton(10,network,local_58);
    if (iVar3 == 1) {
      if ((uVar1 < 0x11) && ((uVar1 != 0x10 || (uVar2 == 0)))) {
        if ((uVar1 != 0) && (iVar3 = memcmp(check + 8,local_58,(long)(int)uVar1), iVar3 != 0)) {
          return false;
        }
        if ((uVar2 == 0) ||
           (((uint)(check[(long)(int)uVar1 + 8] ^ local_58[(int)uVar1]) &
            0xff << (8U - (char)uVar2 & 0x1f)) != 0)) {
          ipv6_local._7_1_ = true;
        }
        else {
          ipv6_local._7_1_ = false;
        }
      }
      else {
        ipv6_local._7_1_ = false;
      }
    }
    else {
      ipv6_local._7_1_ = false;
    }
  }
  else {
    ipv6_local._7_1_ = false;
  }
  return ipv6_local._7_1_;
}

Assistant:

UNITTEST bool Curl_cidr6_match(const char *ipv6,
                               const char *network,
                               unsigned int bits)
{
#ifdef ENABLE_IPV6
  int bytes;
  int rest;
  unsigned char address[16];
  unsigned char check[16];

  if(!bits)
    bits = 128;

  bytes = bits/8;
  rest = bits & 0x07;
  if(1 != Curl_inet_pton(AF_INET6, ipv6, address))
    return FALSE;
  if(1 != Curl_inet_pton(AF_INET6, network, check))
    return FALSE;
  if((bytes > 16) || ((bytes == 16) && rest))
    return FALSE;
  if(bytes && memcmp(address, check, bytes))
    return FALSE;
  if(rest && !((address[bytes] ^ check[bytes]) & (0xff << (8 - rest))))
    return FALSE;

  return TRUE;
#else
  (void)ipv6;
  (void)network;
  (void)bits;
  return FALSE;
#endif
}